

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O0

void gen_mls16_i32(TCGContext_conflict1 *tcg_ctx,TCGv_i32 d,TCGv_i32 a,TCGv_i32 b)

{
  TCGv_i32 b_local;
  TCGv_i32 a_local;
  TCGv_i32 d_local;
  TCGContext_conflict1 *tcg_ctx_local;
  
  gen_helper_neon_mul_u16(tcg_ctx,a,a,b);
  gen_helper_neon_sub_u16(tcg_ctx,d,d,a);
  return;
}

Assistant:

static void gen_mls16_i32(TCGContext *tcg_ctx, TCGv_i32 d, TCGv_i32 a, TCGv_i32 b)
{
    gen_helper_neon_mul_u16(tcg_ctx, a, a, b);
    gen_helper_neon_sub_u16(tcg_ctx, d, d, a);
}